

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_system.cpp
# Opt level: O3

bool __thiscall LinearSystem::Choice(LinearSystem *this,int pos,ChoiceType choice_type)

{
  ExtendedMatrix *this_00;
  pointer pOVar1;
  LinearSystem *this_01;
  bool bVar2;
  Fraction *a;
  Fraction *pFVar3;
  Fraction extraout_RAX;
  int column;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  double __x;
  double __x_00;
  Fraction best_item;
  uint local_68;
  int local_64;
  Fraction local_60;
  ulong local_58;
  Fraction local_50;
  LinearSystem *local_48;
  Fraction local_40;
  Fraction local_38;
  
  uVar6 = (ulong)(uint)pos;
  local_68 = this->n_;
  if (choice_type == Column) {
    uVar7 = pos + 1;
  }
  else {
    uVar7 = this->m_;
    if (choice_type == Row) {
      local_68 = pos + 1;
    }
    else if (choice_type == Without) {
      a = ExtendedMatrix::At(&this->system_,pos,pos);
      pFVar3 = &local_60;
      Fraction::Fraction(pFVar3,0);
      goto LAB_0010ce65;
    }
  }
  this_00 = &this->system_;
  local_48 = this;
  pFVar3 = ExtendedMatrix::At(this_00,pos,pos);
  local_60 = *pFVar3;
  local_64 = pos;
  local_58 = uVar6;
  if (pos < (int)local_68) {
    uVar8 = uVar6;
    do {
      uVar4 = local_58 & 0xffffffff;
      iVar5 = (int)uVar6;
      if ((int)local_58 < (int)uVar7) {
        do {
          column = (int)uVar4;
          ExtendedMatrix::At(this_00,iVar5,column);
          fabs(__x);
          bVar2 = operator<(&local_60,&local_50);
          if (bVar2) {
            ExtendedMatrix::At(this_00,iVar5,column);
            fabs(__x_00);
            uVar8 = uVar6;
            local_64 = column;
            local_60 = extraout_RAX;
          }
          uVar4 = (ulong)(column + 1U);
        } while (uVar7 != column + 1U);
      }
      pos = (int)uVar8;
      uVar6 = (ulong)(iVar5 + 1U);
    } while (iVar5 + 1U != local_68);
  }
  Fraction::Fraction(&local_38,0);
  this_01 = local_48;
  iVar5 = (int)local_58;
  PerformOperation(local_48,SwapRows,iVar5,pos,local_38);
  Fraction::Fraction(&local_40,0);
  PerformOperation(this_01,SwapColumns,iVar5,local_64,local_40);
  pOVar1 = (this_01->history_).
           super__Vector_base<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (((this_01->history_).
       super__Vector_base<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>._M_impl
       .super__Vector_impl_data._M_start != pOVar1) && (pOVar1[-1].operation_type != MainOutput)) {
    std::vector<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>::emplace_back<>
              (&this_01->history_);
  }
  pFVar3 = &local_50;
  Fraction::Fraction(pFVar3,0);
  a = &local_60;
LAB_0010ce65:
  bVar2 = operator!=(a,pFVar3);
  return bVar2;
}

Assistant:

bool LinearSystem::Choice(int pos, Options::ChoiceType choice_type) {
  int max_row = n_, max_column = m_;
  if (choice_type == Options::ChoiceType::Without) {
    return system_.At(pos, pos) != 0;
  } else if (choice_type == Options::ChoiceType::Row) {
    max_row = pos + 1;
  } else if (choice_type == Options::ChoiceType::Column) {
    max_column = pos + 1;
  }

  int best_column = pos, best_row = pos;
  Fraction best_item = system_.At(pos, pos);
  for (int row = pos; row < max_row; ++row) {
    for (int column = pos; column < max_column; ++column) {
      if (best_item < fabs(system_.At(row, column))) {
        best_row = row;
        best_column = column;
        best_item = fabs(system_.At(row, column));
      }
    }
  }

  PerformOperation(OperationType::SwapRows, pos, best_row, 0);
  PerformOperation(OperationType::SwapColumns, pos, best_column, 0);

  AddMainOutput();

  return best_item != 0;
}